

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tui.cc
# Opt level: O0

bool handle_anylevel_key(TUI_context *ctx,int key)

{
  int key_local;
  TUI_context *ctx_local;
  
  if (((key == 3) || (key == 0x51)) || (key == 0x71)) {
    ctx->quit = true;
    ctx_local._7_1_ = true;
  }
  else if (key == 0x19a) {
    resize_term(0);
    erase();
    setup_display(ctx);
    ctx_local._7_1_ = true;
  }
  else {
    ctx_local._7_1_ = false;
  }
  return ctx_local._7_1_;
}

Assistant:

static bool handle_anylevel_key(TUI_context &ctx, int key)
{
    switch (key) {
    default:
        return false;
    case 'q': case 'Q':
    case 3:   // console break
        ctx.quit = true;
        return true;
    case KEY_RESIZE:
        resize_term(0, 0);
        erase();
        setup_display(ctx);
        return true;
    }
}